

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.cpp
# Opt level: O0

uint64_t DecompressAmount(uint64_t x)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  long in_RDI;
  long in_FS_OFFSET;
  int d;
  uint64_t n;
  int e;
  uint64_t local_28;
  uint local_1c;
  uint64_t local_10;
  
  if (in_RDI == 0) {
    local_10 = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RDI - 1U;
    local_1c = SUB164(auVar1 % ZEXT816(10),0);
    uVar2 = (in_RDI - 1U) / 10;
    if (local_1c < 9) {
      local_28 = (uVar2 / 9) * 10 + (long)((int)(uVar2 % 9) + 1);
    }
    else {
      local_28 = uVar2 + 1;
    }
    for (; local_1c != 0; local_1c = local_1c - 1) {
      local_28 = local_28 * 10;
    }
    local_10 = local_28;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

uint64_t DecompressAmount(uint64_t x)
{
    // x = 0  OR  x = 1+10*(9*n + d - 1) + e  OR  x = 1+10*(n - 1) + 9
    if (x == 0)
        return 0;
    x--;
    // x = 10*(9*n + d - 1) + e
    int e = x % 10;
    x /= 10;
    uint64_t n = 0;
    if (e < 9) {
        // x = 9*n + d - 1
        int d = (x % 9) + 1;
        x /= 9;
        // x = n
        n = x*10 + d;
    } else {
        n = x+1;
    }
    while (e) {
        n *= 10;
        e--;
    }
    return n;
}